

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

void dxil_spv::Converter::Impl::get_shader_model
               (Module *module,String *model,uint32_t *major,uint32_t *minor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar1;
  uint uVar2;
  NamedMDNode *this;
  MDNode *node;
  String local_50;
  
  uVar2 = (uint)minor;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
             &local_50,"dx.shaderModel","");
  this = LLVMBC::Module::getNamedMetadata(module,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    free_in_thread(local_50._M_dataplus._M_p);
  }
  if (this == (NamedMDNode *)0x0) {
    if (major != (uint32_t *)0x0) {
      *major = 6;
    }
    if (minor != (uint32_t *)0x0) {
      *minor = 0;
    }
    if (model != (String *)0x0) {
      model->_M_string_length = 0;
      *(model->_M_dataplus)._M_p = '\0';
    }
  }
  else {
    node = LLVMBC::NamedMDNode::getOperand(this,0);
    if (model != (String *)0x0) {
      get_string_metadata_abi_cxx11_(&local_50,(dxil_spv *)node,(MDNode *)0x0,uVar2);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (model,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        free_in_thread(local_50._M_dataplus._M_p);
      }
    }
    if (major != (uint32_t *)0x0) {
      uVar2 = get_constant_metadata<unsigned_int>(node,1);
      *major = uVar2;
    }
    if (minor != (uint32_t *)0x0) {
      uVar2 = get_constant_metadata<unsigned_int>(node,2);
      *minor = uVar2;
    }
  }
  return;
}

Assistant:

void Converter::Impl::get_shader_model(const llvm::Module &module, String *model, uint32_t *major, uint32_t *minor)
{
	auto *resource_meta = module.getNamedMetadata("dx.shaderModel");
	if (!resource_meta)
	{
		if (major)
			*major = 6;
		if (minor)
			*minor = 0;
		if (model)
			model->clear();
	}
	else
	{
		auto *meta = resource_meta->getOperand(0);

		if (model)
			*model = get_string_metadata(meta, 0);
		if (major)
			*major = get_constant_metadata(meta, 1);
		if (minor)
			*minor = get_constant_metadata(meta, 2);
	}
}